

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O0

bool __thiscall mpt::pipe<int>::push(pipe<int> *this,int *elem)

{
  ulong uVar1;
  int *t;
  instance *piStack_28;
  uint8_t buf [4];
  queue *d;
  int *elem_local;
  pipe<int> *this_local;
  
  piStack_28 = reference<mpt::pipe<int>::instance>::instance(&this->_d);
  if (piStack_28 == (instance *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    t._4_4_ = *elem;
    uVar1 = (**(code **)(*(long *)&piStack_28->super_type + 0x48))(piStack_28,(long)&t + 4,4);
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool push(const T & elem)
	{
		io::queue *d;
		if (!(d = _d.instance())) {
			return false;
		}
		uint8_t buf[sizeof(T)];
		T *t = static_cast<T *>(static_cast<void *>(buf));
		new (t) T(elem);
		if (d->push(t, sizeof(T))) {
			return true;
		}
		t->~T();
		return false;
	}